

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O2

Query * q_min_of(Query *__return_storage_ptr__,uint32_t count,
                vector<Query,_std::allocator<Query>_> *queries)

{
  Query::Query(__return_storage_ptr__,count,queries);
  return __return_storage_ptr__;
}

Assistant:

Query q_min_of(uint32_t count, std::vector<Query> &&queries) {
    return Query(count, std::move(queries));
}